

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

CatalogEntryLookup * __thiscall
duckdb::Catalog::TryLookupEntryInternal
          (Catalog *this,CatalogTransaction transaction,string *schema,EntryLookupInfo *lookup_info)

{
  bool bVar1;
  int iVar2;
  SchemaCatalogEntry *pSVar3;
  undefined4 extraout_var;
  EntryLookupInfo *in_RCX;
  long *in_RSI;
  CatalogEntryLookup *in_RDI;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> schema_entry;
  EntryLookupInfo schema_lookup;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  CatalogEntryLookup *this_00;
  byte local_f1;
  undefined1 local_f0 [8];
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  CatalogEntry *local_c8;
  undefined1 local_c0 [8];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  SchemaCatalogEntry *local_98;
  undefined1 local_90 [55];
  allocator local_59;
  string local_58 [48];
  BoundAtClause *local_28;
  EntryLookupInfo *local_20;
  
  this_00 = in_RDI;
  local_20 = in_RCX;
  local_28 = (BoundAtClause *)EntryLookupInfo::GetAtClause(in_RCX);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_28);
  local_f1 = 0;
  if (bVar1) {
    local_f1 = (**(code **)(*in_RSI + 0xb8))();
    local_f1 = local_f1 ^ 0xff;
  }
  if ((local_f1 & 1) == 0) {
    EntryLookupInfo::SchemaLookup
              ((EntryLookupInfo *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               (string *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    memcpy(local_c0,&stack0x00000008,0x28);
    local_98 = (SchemaCatalogEntry *)(**(code **)(*in_RSI + 0x40))(in_RSI,local_90,1);
    bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_98);
    if (bVar1) {
      pSVar3 = optional_ptr<duckdb::SchemaCatalogEntry,_true>::operator->
                         ((optional_ptr<duckdb::SchemaCatalogEntry,_true> *)
                          CONCAT44(uStack_b4,uStack_b8));
      memcpy(local_f0,&stack0x00000008,0x28);
      iVar2 = (*(pSVar3->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x1c])
                        (pSVar3,local_20);
      local_c8 = (CatalogEntry *)CONCAT44(extraout_var,iVar2);
      bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_c8);
      if (bVar1) {
        (in_RDI->schema).ptr = local_98;
        (in_RDI->entry).ptr = local_c8;
        ErrorData::ErrorData((ErrorData *)CONCAT44(uStack_e4,uStack_e8));
      }
      else {
        (in_RDI->schema).ptr = local_98;
        optional_ptr<duckdb::CatalogEntry,_true>::optional_ptr(&in_RDI->entry,(CatalogEntry *)0x0);
        ErrorData::ErrorData((ErrorData *)CONCAT44(uStack_e4,uStack_e8));
      }
    }
    else {
      optional_ptr<duckdb::SchemaCatalogEntry,_true>::optional_ptr
                (&in_RDI->schema,(SchemaCatalogEntry *)0x0);
      optional_ptr<duckdb::CatalogEntry,_true>::optional_ptr(&in_RDI->entry,(CatalogEntry *)0x0);
      ErrorData::ErrorData((ErrorData *)CONCAT44(uStack_b4,uStack_b8));
    }
  }
  else {
    optional_ptr<duckdb::SchemaCatalogEntry,_true>::optional_ptr
              (&in_RDI->schema,(SchemaCatalogEntry *)0x0);
    optional_ptr<duckdb::CatalogEntry,_true>::optional_ptr(&in_RDI->entry,(CatalogEntry *)0x0);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,"Catalog type does not support time travel",&local_59);
    BinderException::BinderException
              ((BinderException *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               (string *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    ErrorData::ErrorData((ErrorData *)this_00,(exception *)in_RDI);
    BinderException::~BinderException((BinderException *)0x29e7b9);
    ::std::__cxx11::string::~string(local_58);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  return this_00;
}

Assistant:

CatalogEntryLookup Catalog::TryLookupEntryInternal(CatalogTransaction transaction, const string &schema,
                                                   const EntryLookupInfo &lookup_info) {
	if (lookup_info.GetAtClause() && !SupportsTimeTravel()) {
		return {nullptr, nullptr, ErrorData(BinderException("Catalog type does not support time travel"))};
	}
	auto schema_lookup = EntryLookupInfo::SchemaLookup(lookup_info, schema);
	auto schema_entry = LookupSchema(transaction, schema_lookup, OnEntryNotFound::RETURN_NULL);
	if (!schema_entry) {
		return {nullptr, nullptr, ErrorData()};
	}
	auto entry = schema_entry->LookupEntry(transaction, lookup_info);
	if (!entry) {
		return {schema_entry, nullptr, ErrorData()};
	}
	return {schema_entry, entry, ErrorData()};
}